

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ExtensionSet::~ExtensionSet(ExtensionSet *this)

{
  KeyValue *this_00;
  bool bVar1;
  ExtensionSet *this_local;
  
  if (this->arena_ == (Arena *)0x0) {
    ForEach<google::protobuf::internal::ExtensionSet::~ForEach()::__0,google::protobuf::internal::ExtensionSet::PrefetchNta>
              (this);
    bVar1 = is_large(this);
    if (bVar1) {
      this_00 = (this->map_).flat;
      if (this_00 != (KeyValue *)0x0) {
        absl::lts_20250127::
        btree_map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
        ::~btree_map((btree_map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                      *)this_00);
        operator_delete(this_00,0x18);
      }
    }
    else {
      DeleteFlatMap((this->map_).flat,this->flat_capacity_);
    }
  }
  return;
}

Assistant:

ExtensionSet::~ExtensionSet() {
  // Deletes all allocated extensions.
  if (arena_ == nullptr) {
    ForEach([](int /* number */, Extension& ext) { ext.Free(); },
            PrefetchNta{});
    if (ABSL_PREDICT_FALSE(is_large())) {
      delete map_.large;
    } else {
      DeleteFlatMap(map_.flat, flat_capacity_);
    }
  }
}